

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.hpp
# Opt level: O1

bool sciplot::gnuplot::runscript(string *scriptfilename,bool persistent)

{
  int iVar1;
  char *pcVar2;
  long *plVar3;
  long *plVar4;
  char *pcVar5;
  undefined7 in_register_00000031;
  string command;
  long *local_78;
  long local_68;
  long lStack_60;
  long *local_58 [2];
  long local_48 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pcVar2 = "gnuplot ";
  iVar1 = (int)CONCAT71(in_register_00000031,persistent);
  if (iVar1 != 0) {
    pcVar2 = "gnuplot -persistent ";
  }
  pcVar5 = pcVar2 + 8;
  if (iVar1 != 0) {
    pcVar5 = pcVar2 + 0x14;
  }
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,pcVar2,pcVar5);
  std::operator+(&local_38,"\"",scriptfilename);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_38);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_68 = *plVar4;
    lStack_60 = plVar3[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar4;
    local_78 = (long *)*plVar3;
  }
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_58,(ulong)local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  iVar1 = system((char *)local_58[0]);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  return iVar1 == 0;
}

Assistant:

inline auto runscript(std::string scriptfilename, bool persistent) -> bool
{
    std::string command = persistent ? "gnuplot -persistent " : "gnuplot ";
    command += "\"" + scriptfilename + "\"";
    return std::system(command.c_str()) == 0;
}